

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O3

void BailOutRecord::ScheduleLoopBodyCodeGen
               (ScriptFunction *function,ScriptFunction *innerMostInlinee,
               BailOutRecord *bailOutRecord,BailOutKind bailOutKind)

{
  undefined1 *puVar1;
  ushort uVar2;
  InterpreterStackFrame *pIVar3;
  code *pcVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint32 uVar9;
  FunctionBody *this;
  undefined4 *puVar10;
  ScriptContext *pSVar11;
  LoopHeader *this_00;
  LoopEntryPointInfo *pLVar12;
  DynamicProfileInfo *pDVar13;
  FunctionBody *pFVar14;
  undefined4 extraout_var;
  char *pcVar15;
  char *pcVar16;
  FunctionInfo *pFVar17;
  undefined4 extraout_var_00;
  char16 *pcVar18;
  undefined4 extraout_var_01;
  RejitReason RVar19;
  RejitReason RVar20;
  uint x;
  ulong uVar21;
  wchar local_b8 [4];
  char16 debugStringBuffer [42];
  byte local_39;
  ulong local_38;
  
  unique0x10000cf6 = function;
  this = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)function);
  uVar6 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this);
  pFVar17 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if (pFVar17 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                       ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar5) goto LAB_003fe2a4;
    *puVar10 = 0;
    pFVar17 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,ReJITPhase,uVar6,pFVar17->functionId);
  if (bVar5) {
    return;
  }
  local_38 = (ulong)bailOutKind;
  pSVar11 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)this);
  pIVar3 = pSVar11->threadContext->leafInterpreterFrame;
  this_00 = Js::FunctionBody::GetLoopHeader(this,*(uint *)(pIVar3 + 0xcc));
  if (this_00 == (LoopHeader *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x9a4,"(loopHeader != nullptr)","loopHeader != nullptr");
    if (!bVar5) goto LAB_003fe2a4;
    *puVar10 = 0;
  }
  bailOutRecord->bailOutCount = bailOutRecord->bailOutCount + 1;
  if ((int)local_38 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x9aa,"(bailOutKind != IR::BailOutInvalid)",
                       "bailOutKind != IR::BailOutInvalid");
    if (!bVar5) goto LAB_003fe2a4;
    *puVar10 = 0;
  }
  uVar21 = local_38;
  pLVar12 = Js::LoopHeader::GetCurrentEntryPointInfo(this_00);
  uVar7 = pLVar12->totalJittedLoopIterations + pLVar12->jittedLoopIterationsSinceLastBailout;
  pLVar12->totalJittedLoopIterations = uVar7;
  if (0xfe < uVar7) {
    uVar7 = 0xff;
  }
  pLVar12->jittedLoopIterationsSinceLastBailout = 0;
  local_39 = (byte)uVar7 - ((char)DAT_015b0950 + 1U);
  if ((byte)uVar7 < (byte)((char)DAT_015b0950 + 1U)) {
    local_39 = 0;
  }
  CheckPreemptiveRejit(this,(BailOutKind)uVar21,bailOutRecord,&local_39,*(int *)(pIVar3 + 0xcc));
  pLVar12->totalJittedLoopIterations = (uint)local_39;
  if ((this->dynamicProfileInfo).ptr == (DynamicProfileInfo *)0x0 || local_39 != 0) {
    uVar6 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this);
    pFVar17 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if (pFVar17 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar5) goto LAB_003fe2a4;
      *puVar10 = 0;
      pFVar17 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      uVar21 = local_38;
    }
    x = (uint)uVar21;
    bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01599240,ReJITPhase,uVar6,pFVar17->functionId);
    if (bVar5) goto LAB_003fdb5d;
    RVar19 = None;
  }
  else {
LAB_003fdb5d:
    pDVar13 = Js::FunctionBody::GetAnyDynamicProfileInfo(this);
    x = (uint)uVar21;
    if ((uVar21 & 0x30003c00) == 0) {
      RVar20 = None;
      if ((int)x < 0x2000) {
        RVar20 = None;
        switch(x) {
        case 1:
        case 0x1e:
          goto switchD_003fdbd1_caseD_1;
        case 2:
        case 3:
          puVar1 = &(pDVar13->bits).field_0x1;
          *puVar1 = *puVar1 | 2;
          this->field_0x179 = this->field_0x179 | 8;
          RVar20 = FloatTypeSpecDisabled;
          break;
        case 4:
        case 5:
          RVar20 = ImplicitCallFlagsChanged;
          break;
        case 6:
          *(byte *)&pDVar13->bits = *(byte *)&pDVar13->bits | 0x40;
          this->field_0x179 = this->field_0x179 | 8;
          RVar20 = LossyIntTypeSpecDisabled;
          break;
        case 7:
          *(byte *)&pDVar13->bits = *(byte *)&pDVar13->bits | 0x80;
          this->field_0x179 = this->field_0x179 | 8;
          RVar20 = MemOpDisabled;
          break;
        case 8:
        case 10:
        case 0xb:
          RVar20 = InlineeChanged;
          break;
        case 9:
          this->bailOnMisingProfileCount = '\0';
          RVar20 = NoProfile;
          break;
        case 0xd:
          puVar1 = &(pDVar13->bits).field_0x1;
          *puVar1 = *puVar1 | 0x10;
          this->field_0x179 = this->field_0x179 | 8;
          RVar20 = ArrayCheckHoistDisabled;
          break;
        case 0xe:
          RVar20 = ExpectingNativeArray;
          if (0x31 < this_00->rejitCount) {
            RVar20 = None;
          }
          break;
        case 0xf:
          puVar1 = &(pDVar13->bits).field_0x2;
          *puVar1 = *puVar1 | 0x10;
          this->field_0x179 = this->field_0x179 | 8;
          RVar20 = TypedArrayTypeSpecDisabled;
          break;
        case 0x10:
          puVar1 = &(pDVar13->bits).field_0x2;
          *puVar1 = *puVar1 | 0x20;
          this->field_0x179 = this->field_0x179 | 8;
          RVar20 = LdLenIntSpecDisabled;
          break;
        case 0x11:
          puVar1 = &(pDVar13->bits).field_0x1;
          *puVar1 = *puVar1 | 4;
          this->field_0x179 = this->field_0x179 | 8;
          RVar20 = CheckThisDisabled;
          break;
        case 0x12:
          puVar1 = &(pDVar13->bits).field_0x4;
          *puVar1 = *puVar1 | 0x10;
          this->field_0x179 = this->field_0x179 | 8;
          RVar20 = FailedTagCheck;
          break;
        case 0x13:
          uVar9 = Js::FunctionBody::GetCountField(this,ByteCodeInLoopCount);
          RVar20 = FailedTypeCheck;
          if (DAT_015a4db0 < uVar9) {
            puVar1 = &(pDVar13->bits).field_0x4;
            *puVar1 = *puVar1 | 1;
            bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,DisabledObjTypeSpecPhase);
            if (bVar5) {
              uVar6 = Js::FunctionBody::GetLoopNumber(this,this_00);
              iVar8 = (*(this->super_ParseableFunctionInfo).super_FunctionProxy.
                        super_FinalizableObject.super_IRecyclerVisitedObject.
                        _vptr_IRecyclerVisitedObject[7])(this);
              Output::Print(L"Disabled obj type spec in jit loop body for loop %d in %s (%d)\n",
                            (ulong)uVar6,CONCAT44(extraout_var_01,iVar8),
                            (ulong)(this->super_ParseableFunctionInfo).super_FunctionProxy.
                                   m_functionNumber);
              Output::Flush();
            }
          }
          break;
        case 0x14:
        case 0x1b:
          RVar20 = FailedEquivalentFixedFieldTypeCheck - (x == 0x14);
          break;
        case 0x16:
          puVar1 = &(pDVar13->bits).field_0x3;
          *puVar1 = *puVar1 | 0x40;
          this->field_0x179 = this->field_0x179 | 8;
          RVar20 = DisableSwitchOptExpectingInteger;
          break;
        case 0x17:
          puVar1 = &(pDVar13->bits).field_0x3;
          *puVar1 = *puVar1 | 0x40;
          this->field_0x179 = this->field_0x179 | 8;
          RVar20 = DisableSwitchOptExpectingString;
          break;
        case 0x19:
          RVar20 = FailedFixedFieldTypeCheck;
          break;
        case 0x1a:
          RVar20 = FailedFixedFieldCheck;
          break;
        case 0x1c:
          puVar1 = &(pDVar13->bits).field_0x3;
          *puVar1 = *puVar1 | 0x10;
          RVar20 = FloorInliningDisabled;
          break;
        case 0x1d:
          RVar20 = ModByPowerOf2;
          break;
        case 0x21:
          RVar20 = CtorGuardInvalidated;
          break;
        case 0x22:
          puVar1 = &(pDVar13->bits).field_0x2;
          *puVar1 = *puVar1 | 0x80;
          this->field_0x179 = this->field_0x179 | 8;
          RVar20 = BoundCheckHoistDisabled;
          break;
        case 0x23:
          puVar1 = &(pDVar13->bits).field_0x3;
          *puVar1 = *puVar1 | 2;
          this->field_0x179 = this->field_0x179 | 8;
          RVar20 = LoopCountBasedBoundCheckHoistDisabled;
        }
      }
      else if ((int)x < 0x10000) {
        if (x == 0x2000) {
          puVar1 = &(pDVar13->bits).field_0x4;
          *puVar1 = *puVar1 | 2;
          this->field_0x179 = this->field_0x179 | 8;
          RVar20 = PowIntIntTypeSpecDisabled;
        }
        else if (x == 0x4000) {
          puVar1 = &(pDVar13->bits).field_0x1;
          *puVar1 = *puVar1 | 0x40;
          RVar20 = ArrayMissingValueCheckHoistDisabled;
        }
        else if (x == 0x8000) {
          RVar20 = ExpectingConventionalNativeArrayAccess;
        }
      }
      else if ((int)x < 0x40000) {
        if (x == 0x10000) {
          RVar20 = ConvertedNativeArray;
        }
        else if (x == 0x20000) {
          RVar20 = ArrayAccessNeededHelperCall;
        }
      }
      else if (x == 0x40000) {
        puVar1 = &(pDVar13->bits).field_0x2;
        *puVar1 = *puVar1 | 1;
        this->field_0x179 = this->field_0x179 | 8;
        RVar20 = JsArraySegmentHoistDisabled;
      }
      else if (x == 0x100000) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar10 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                           ,0x9f6,"(false)",
                           "How did we reach here ? Stack args opt is currently disabled in loop body gen."
                          );
        if (!bVar5) goto LAB_003fe2a4;
        *puVar10 = 0;
        RVar20 = None;
      }
    }
    else {
switchD_003fdbd1_caseD_1:
      if ((x >> 0xb & 1) == 0) {
        if (x == 0x1f || (uVar21 & 0x30000000) != 0) {
          *(uint *)&pDVar13->bits = *(uint *)&pDVar13->bits | 0x20;
          RVar20 = DivIntTypeSpecDisabled;
        }
        else {
          *(uint *)&pDVar13->bits = *(uint *)&pDVar13->bits | 2;
          RVar20 = AggressiveIntTypeSpecDisabled;
        }
      }
      else {
        *(byte *)&pDVar13->bits = *(byte *)&pDVar13->bits | 8;
        RVar20 = AggressiveMulIntTypeSpecDisabled;
      }
      this->field_0x179 = this->field_0x179 | 8;
    }
    uVar6 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this);
    pFVar17 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if (pFVar17 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar5) goto LAB_003fe2a4;
      *puVar10 = 0;
      pFVar17 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      x = (uint)local_38;
    }
    bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01599240,ReJITPhase,uVar6,pFVar17->functionId);
    RVar19 = Forced;
    if (!bVar5) {
      RVar19 = RVar20;
    }
    if (RVar20 != None) {
      RVar19 = RVar20;
    }
  }
  uVar6 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this);
  pFVar17 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if (pFVar17 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                       ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar5) goto LAB_003fe2a4;
    *puVar10 = 0;
    pFVar17 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    x = (uint)local_38;
  }
  bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01599240,ReJITPhase,uVar6,pFVar17->functionId);
  RVar20 = Forced;
  if (RVar19 != None) {
    RVar20 = RVar19;
  }
  if (!bVar5) {
    RVar20 = RVar19;
  }
  bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,ReJITPhase);
  if ((bVar5) &&
     ((DAT_015bf3c0 == DAT_015bf3c8 ||
      (bVar5 = Js::NumberSet::Contains((NumberSet *)&DAT_015bf3a0,x), bVar5)))) {
    pFVar14 = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)stack0xffffffffffffffa0)
    ;
    iVar8 = (*(pFVar14->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(pFVar14);
    uVar6 = Js::FunctionBody::GetLoopNumber(this,this_00);
    pcVar15 = GetBailOutKindName((BailOutKind)local_38);
    pcVar16 = GetRejitReasonName(RVar20);
    x = (uint)local_38;
    Output::Print(L"Bailout from loop: function: %s, loopNumber: %d, bailOutKindName: (%S), reJitReason: %S\r\n"
                  ,CONCAT44(extraout_var,iVar8),(ulong)uVar6,pcVar15,pcVar16);
    Output::Flush();
  }
  pSVar11 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)this);
  Js::ScriptContext::LogBailout(pSVar11,this,x);
  if (RVar20 != None) {
    pSVar11 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)this);
    Js::ScriptContext::LogRejit(pSVar11,this,RVar20);
    uVar6 = Js::FunctionBody::GetLoopInterpretCount(this,this_00);
    this_00->interpretCount = uVar6 - 2;
    Js::LoopHeader::CreateEntryPoint(this_00);
    this_00->rejitCount = this_00->rejitCount + 1;
    uVar6 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this);
    pFVar17 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if (pFVar17 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar5) {
LAB_003fe2a4:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar10 = 0;
      pFVar17 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,ReJITPhase,uVar6,pFVar17->functionId);
    if (bVar5) {
      iVar8 = (*(this->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(this);
      pcVar18 = Js::FunctionProxy::GetDebugNumberSet((FunctionProxy *)this,(wchar (*) [42])local_b8)
      ;
      uVar6 = Js::FunctionBody::GetLoopNumber(this,this_00);
      uVar2 = bailOutRecord->bailOutCount;
      pcVar15 = GetRejitReasonName(RVar20);
      Output::Print(L"Rejit(loop): function: %s (%s) loop: %u bailOutCount: %hu reason: %S",
                    CONCAT44(extraout_var_00,iVar8),pcVar18,(ulong)uVar6,(ulong)uVar2,pcVar15);
      if ((BailOutKind)local_38 != BailOutInvalid) {
        pcVar15 = GetBailOutKindName((BailOutKind)local_38);
        Output::Print(L" (%S)",pcVar15);
      }
      Output::Print(L"\n");
      Output::Flush();
    }
  }
  return;
}

Assistant:

void BailOutRecord::ScheduleLoopBodyCodeGen(Js::ScriptFunction * function, Js::ScriptFunction * innerMostInlinee, BailOutRecord const * bailOutRecord, IR::BailOutKind bailOutKind)
{
    Assert(bailOutKind != IR::LazyBailOut);
    Js::FunctionBody * executeFunction = function->GetFunctionBody();

    if (PHASE_OFF(Js::ReJITPhase, executeFunction))
    {
        return;
    }

    Js::LoopHeader * loopHeader = nullptr;

    Js::InterpreterStackFrame * interpreterFrame = executeFunction->GetScriptContext()->GetThreadContext()->GetLeafInterpreterFrame();

    loopHeader = executeFunction->GetLoopHeader(interpreterFrame->GetCurrentLoopNum());

    Assert(loopHeader != nullptr);

    BailOutRecord * bailOutRecordNotConst = (BailOutRecord *)(void *)bailOutRecord;
    bailOutRecordNotConst->bailOutCount++;

    RejitReason rejitReason = RejitReason::None;
    Assert(bailOutKind != IR::BailOutInvalid);

    Js::LoopEntryPointInfo* entryPointInfo = loopHeader->GetCurrentEntryPointInfo();

    entryPointInfo->totalJittedLoopIterations += entryPointInfo->jittedLoopIterationsSinceLastBailout;
    entryPointInfo->jittedLoopIterationsSinceLastBailout = 0;
    uint8 totalJittedLoopIterations = entryPointInfo->totalJittedLoopIterations > 255 ? 255 : static_cast<uint8>(entryPointInfo->totalJittedLoopIterations);
    totalJittedLoopIterations = totalJittedLoopIterations <= Js::LoopEntryPointInfo::GetDecrLoopCountPerBailout() ? 0 : totalJittedLoopIterations - Js::LoopEntryPointInfo::GetDecrLoopCountPerBailout();

    CheckPreemptiveRejit(executeFunction, bailOutKind, bailOutRecordNotConst, totalJittedLoopIterations, interpreterFrame->GetCurrentLoopNum());

    entryPointInfo->totalJittedLoopIterations = totalJittedLoopIterations;

    if ((executeFunction->HasDynamicProfileInfo() && totalJittedLoopIterations == 0) ||
        PHASE_FORCE(Js::ReJITPhase, executeFunction))
    {
        Js::DynamicProfileInfo * profileInfo = executeFunction->GetAnyDynamicProfileInfo();

        if ((bailOutKind & (IR::BailOutOnResultConditions | IR::BailOutOnDivSrcConditions)) || bailOutKind == IR::BailOutIntOnly || bailOutKind == IR::BailOnIntMin)
        {
            if (bailOutKind & IR::BailOutOnMulOverflow)
            {
                profileInfo->DisableAggressiveMulIntTypeSpec(true);
                rejitReason = RejitReason::AggressiveMulIntTypeSpecDisabled;
            }
            else if ((bailOutKind & (IR::BailOutOnDivByZero | IR::BailOutOnDivOfMinInt)) || bailOutKind == IR::BailOnDivResultNotInt)
            {
                profileInfo->DisableDivIntTypeSpec(true);
                rejitReason = RejitReason::DivIntTypeSpecDisabled;
            }
            else
            {
                profileInfo->DisableAggressiveIntTypeSpec(true);
                rejitReason = RejitReason::AggressiveIntTypeSpecDisabled;
            }
            executeFunction->SetDontRethunkAfterBailout();
        }
        else switch(bailOutKind)
        {
            case IR::BailOutOnNotPrimitive:
                profileInfo->DisableLossyIntTypeSpec();
                executeFunction->SetDontRethunkAfterBailout();
                rejitReason = RejitReason::LossyIntTypeSpecDisabled;
                break;

            case IR::BailOutOnMemOpError:
                profileInfo->DisableMemOp();
                executeFunction->SetDontRethunkAfterBailout();
                rejitReason = RejitReason::MemOpDisabled;
                break;

            case IR::BailOutPrimitiveButString:
            case IR::BailOutNumberOnly:
                profileInfo->DisableFloatTypeSpec();
                executeFunction->SetDontRethunkAfterBailout();
                rejitReason = RejitReason::FloatTypeSpecDisabled;
                break;

            case IR::BailOutOnImplicitCalls:
            case IR::BailOutOnImplicitCallsPreOp:
                rejitReason = RejitReason::ImplicitCallFlagsChanged;
                break;

            case IR::BailOutExpectingInteger:
                profileInfo->DisableSwitchOpt();
                executeFunction->SetDontRethunkAfterBailout();
                rejitReason = RejitReason::DisableSwitchOptExpectingInteger;
                break;

            case IR::BailOutExpectingString:
                profileInfo->DisableSwitchOpt();
                executeFunction->SetDontRethunkAfterBailout();
                rejitReason = RejitReason::DisableSwitchOptExpectingString;
                break;

            case IR::BailOnStackArgsOutOfActualsRange:
                AssertMsg(false, "How did we reach here ? Stack args opt is currently disabled in loop body gen.");
                break;

            case IR::BailOnModByPowerOf2:
                rejitReason = RejitReason::ModByPowerOf2;
                break;

            case IR::BailOutOnNotArray:
                profileInfo->DisableArrayCheckHoist(true);
                executeFunction->SetDontRethunkAfterBailout();
                rejitReason = RejitReason::ArrayCheckHoistDisabled;
                break;

            case IR::BailOutOnNotNativeArray:
                // REVIEW: We have an issue with array profile info.  The info on the type of array we have won't
                //         get fixed by rejitting.  For now, just give up after 50 rejits.
                if (loopHeader->GetRejitCount() >= 50)
                {
                    rejitReason = RejitReason::None;
                }
                else
                {
                    rejitReason = RejitReason::ExpectingNativeArray;
                }
                break;

            case IR::BailOutConvertedNativeArray:
                rejitReason = RejitReason::ConvertedNativeArray;
                break;

            case IR::BailOutConventionalTypedArrayAccessOnly:
                profileInfo->DisableTypedArrayTypeSpec(true);
                executeFunction->SetDontRethunkAfterBailout();
                rejitReason = RejitReason::TypedArrayTypeSpecDisabled;
                break;

            case IR::BailOutConventionalNativeArrayAccessOnly:
                rejitReason = RejitReason::ExpectingConventionalNativeArrayAccess;
                break;

            case IR::BailOutOnMissingValue:
                profileInfo->DisableArrayMissingValueCheckHoist(true);
                rejitReason = RejitReason::ArrayMissingValueCheckHoistDisabled;
                break;

            case IR::BailOutOnArrayAccessHelperCall:
                // This is a pre-op bailout, so the interpreter will update the profile data for this byte-code instruction to
                // prevent excessive bailouts here in the future
                rejitReason = RejitReason::ArrayAccessNeededHelperCall;
                break;

            case IR::BailOutOnInvalidatedArrayHeadSegment:
                profileInfo->DisableJsArraySegmentHoist(true);
                executeFunction->SetDontRethunkAfterBailout();
                rejitReason = RejitReason::JsArraySegmentHoistDisabled;
                break;

            case IR::BailOutOnIrregularLength:
                profileInfo->DisableLdLenIntSpec();
                executeFunction->SetDontRethunkAfterBailout();
                rejitReason = RejitReason::LdLenIntSpecDisabled;
                break;

            case IR::BailOutOnFailedHoistedBoundCheck:
                profileInfo->DisableBoundCheckHoist(true);
                executeFunction->SetDontRethunkAfterBailout();
                rejitReason = RejitReason::BoundCheckHoistDisabled;
                break;

            case IR::BailOutOnFailedHoistedLoopCountBasedBoundCheck:
                profileInfo->DisableLoopCountBasedBoundCheckHoist(true);
                executeFunction->SetDontRethunkAfterBailout();
                rejitReason = RejitReason::LoopCountBasedBoundCheckHoistDisabled;
                break;

            case IR::BailOutOnInlineFunction:
            case IR::BailOutOnPolymorphicInlineFunction:
            case IR::BailOutOnFailedPolymorphicInlineTypeCheck:
                rejitReason = RejitReason::InlineeChanged;
                break;

            case IR::BailOutOnNoProfile:
                rejitReason = RejitReason::NoProfile;
                executeFunction->ResetBailOnMisingProfileCount();
                break;

            case IR::BailOutCheckThis:
                profileInfo->DisableCheckThis();
                executeFunction->SetDontRethunkAfterBailout();
                rejitReason = RejitReason::CheckThisDisabled;
                break;

            case IR::BailOutFailedTypeCheck:
                // An inline cache must have gone from monomorphic to polymorphic.
                // This is already noted in the profile data, so optimization of the given ld/st will
                // be inhibited on re-jit.
                // Consider disabling the optimization across the function after n failed type checks.

                // Disable ObjTypeSpec in a large loop body after the first rejit itself.
                // Rejitting a large loop body takes more time and the fact that loop bodies are prioritized ahead of functions to be jitted only augments the problem.
                if(executeFunction->GetByteCodeInLoopCount() > (uint)CONFIG_FLAG(LoopBodySizeThresholdToDisableOpts))
                {
                    profileInfo->DisableObjTypeSpecInJitLoopBody();
                    if(PHASE_TRACE1(Js::DisabledObjTypeSpecPhase))
                    {
                        Output::Print(_u("Disabled obj type spec in jit loop body for loop %d in %s (%d)\n"),
                            executeFunction->GetLoopNumber(loopHeader), executeFunction->GetDisplayName(), executeFunction->GetFunctionNumber());
                        Output::Flush();
                    }
                }

                rejitReason = RejitReason::FailedTypeCheck;
                break;

            case IR::BailOutFailedFixedFieldTypeCheck:
                // An inline cache must have gone from monomorphic to polymorphic or some fixed field
                // became non-fixed.  Either one is already noted in the profile data and type system,
                // so optimization of the given instruction will be inhibited on re-jit.
                // Consider disabling the optimization across the function after n failed type checks.
                rejitReason = RejitReason::FailedFixedFieldTypeCheck;
                break;

            case IR::BailOutFailedEquivalentTypeCheck:
            case IR::BailOutFailedEquivalentFixedFieldTypeCheck:
                rejitReason = bailOutKind == IR::BailOutFailedEquivalentTypeCheck ?
                    RejitReason::FailedEquivalentTypeCheck : RejitReason::FailedEquivalentFixedFieldTypeCheck;
                break;

            case IR::BailOutFailedCtorGuardCheck:
                // (ObjTypeSpec): Consider scheduling re-JIT right after the first bailout.  We will never successfully execute the
                // function from which we just bailed out, unless we take a different code path through it.

                // A constructor cache guard may be invalidated for one of two reasons:
                // a) the constructor's prototype property has changed, or
                // b) one of the properties protected by the guard (this constructor cache served as) has changed in some way (e.g. became
                // read-only).
                // In the former case, the cache itself will be marked as polymorphic and on re-JIT we won't do the optimization.
                // In the latter case, the inline cache for the offending property will be cleared and on re-JIT the guard will not be enlisted
                // to protect that property operation.
                rejitReason = RejitReason::CtorGuardInvalidated;
                break;

            case IR::BailOutOnFloor:
            {
                profileInfo->DisableFloorInlining();
                rejitReason = RejitReason::FloorInliningDisabled;
                break;
            }

            case IR::BailOutFailedFixedFieldCheck:
                rejitReason = RejitReason::FailedFixedFieldCheck;
                break;

            case IR::BailOutOnTaggedValue:
                profileInfo->DisableTagCheck();
                executeFunction->SetDontRethunkAfterBailout();
                rejitReason = RejitReason::FailedTagCheck;
                break;

            case IR::BailOutOnPowIntIntOverflow:
                profileInfo->DisablePowIntIntTypeSpec();
                executeFunction->SetDontRethunkAfterBailout();
                rejitReason = RejitReason::PowIntIntTypeSpecDisabled;
                break;
        }

        if(PHASE_FORCE(Js::ReJITPhase, executeFunction) && rejitReason == RejitReason::None)
        {
            rejitReason = RejitReason::Forced;
        }
    }

    if (PHASE_FORCE(Js::ReJITPhase, executeFunction) && rejitReason == RejitReason::None)
    {
        rejitReason = RejitReason::Forced;
    }

    REJIT_KIND_TESTTRACE(bailOutKind, _u("Bailout from loop: function: %s, loopNumber: %d, bailOutKindName: (%S), reJitReason: %S\r\n"),
        function->GetFunctionBody()->GetDisplayName(), executeFunction->GetLoopNumber(loopHeader),
        ::GetBailOutKindName(bailOutKind), GetRejitReasonName(rejitReason));

    JS_ETW(EventWriteJSCRIPT_BACKEND_BAILOUT_FROM_LOOP_BODY(
        function->GetFunctionBody()->GetLocalFunctionId(), function->GetFunctionBody()->GetSourceContextId(),
        function->GetFunctionBody()->GetDisplayName(), executeFunction->GetLoopNumber(loopHeader),
        bailOutKind, GetRejitReasonName(rejitReason)));

#ifdef REJIT_STATS
    executeFunction->GetScriptContext()->LogBailout(executeFunction, bailOutKind);
#endif

    if (rejitReason != RejitReason::None)
    {
#ifdef REJIT_STATS
        executeFunction->GetScriptContext()->LogRejit(executeFunction, rejitReason);
#endif
        // Single bailout triggers re-JIT of loop body. the actual codegen scheduling of the new
        // loop body happens in the interpreter
        loopHeader->interpretCount = executeFunction->GetLoopInterpretCount(loopHeader) - 2;
        loopHeader->CreateEntryPoint();
        loopHeader->IncRejitCount();

#if ENABLE_DEBUG_CONFIG_OPTIONS
        if(PHASE_TRACE(Js::ReJITPhase, executeFunction))
        {
            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
            Output::Print(
                _u("Rejit(loop): function: %s (%s) loop: %u bailOutCount: %hu reason: %S"),
                executeFunction->GetDisplayName(),
                executeFunction->GetDebugNumberSet(debugStringBuffer),
                executeFunction->GetLoopNumber(loopHeader),
                bailOutRecord->bailOutCount,
                GetRejitReasonName(rejitReason));
            if(bailOutKind != IR::BailOutInvalid)
            {
                Output::Print(_u(" (%S)"), ::GetBailOutKindName(bailOutKind));
            }
            Output::Print(_u("\n"));
            Output::Flush();
        }
#endif
    }
}